

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status google::protobuf::json_internal::anon_unknown_5::
       ParseFieldMask<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  Field this;
  undefined8 f;
  bool bVar1;
  Status *x;
  LocationWith<google::protobuf::json_internal::MaybeOwnedString> *pLVar2;
  reference pvVar3;
  ParseOptions *pPVar4;
  MessagePath *in_RCX;
  char *in_R8;
  string_view sVar5;
  undefined1 auVar6 [16];
  ConvertibleToStringView text;
  string_view x_00;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  uchar local_1a1;
  const_iterator pvStack_1a0;
  char c;
  const_iterator __end4;
  const_iterator __begin4;
  string_view *__range4;
  string snake_path;
  string_view path;
  const_iterator __end3;
  const_iterator __begin3;
  ConvertibleToStringView local_e8;
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d8;
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_c0;
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *__range3;
  Field local_b0;
  Field paths_field;
  string_view paths;
  undefined1 local_80 [8];
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  Msg<google::protobuf::json_internal::ParseProto3Type> *msg_local;
  Desc<google::protobuf::json_internal::ParseProto3Type> *desc_local;
  JsonLexer *lex_local;
  Status *_status;
  
  str.
  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  .field_1.data_.loc.path = in_RCX;
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)local_80,(JsonLexer *)desc);
  x = absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_80);
  absl::lts_20240722::Status::Status((Status *)lex,x);
  bVar1 = absl::lts_20240722::Status::ok((Status *)lex);
  paths._M_str._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
  paths._M_str._1_3_ = 0;
  if (!paths._M_str._0_1_) {
    absl::lts_20240722::Status::~Status((Status *)lex);
  }
  if ((uint)paths._M_str == 0) {
    pLVar2 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_80);
    sVar5 = MaybeOwnedString::AsView(&pLVar2->value);
    paths._M_len = (size_t)sVar5._M_str;
    paths_field = (Field)sVar5._M_len;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&paths_field);
    if (bVar1) {
      absl::lts_20240722::OkStatus();
      paths._M_str._0_4_ = 1;
    }
    else {
      JsonLocation::SourceLocation::current();
      local_b0 = Proto3Type::MustHaveField(msg,1);
      sVar5._M_str = (char *)paths._M_len;
      sVar5._M_len = (size_t)paths_field;
      absl::lts_20240722::strings_internal::ConvertibleToStringView::ConvertibleToStringView
                (&local_e8,sVar5);
      text.value_._M_str = (char *)0x2c;
      text.value_._M_len = (size_t)local_e8.value_._M_str;
      absl::lts_20240722::StrSplit<char>
                (&local_d8,(lts_20240722 *)local_e8.value_._M_len,text,(char)in_R8);
      local_c0 = &local_d8;
      absl::lts_20240722::strings_internal::
      Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::begin((const_iterator *)&__end3.delimiter_,local_c0);
      absl::lts_20240722::strings_internal::
      Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::end((const_iterator *)&path._M_str,local_c0);
      while (bVar1 = absl::lts_20240722::strings_internal::operator!=
                               ((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)&__end3.delimiter_,
                                (SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)&path._M_str), bVar1) {
        pvVar3 = absl::lts_20240722::strings_internal::
                 SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator*((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)&__end3.delimiter_);
        snake_path.field_2._8_8_ = pvVar3->_M_len;
        path._M_len = (size_t)pvVar3->_M_str;
        std::__cxx11::string::string((string *)&__range4);
        std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&snake_path.field_2 + 8));
        std::__cxx11::string::reserve((ulong)&__range4);
        __begin4 = snake_path.field_2._M_local_buf + 8;
        __end4 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                           ((basic_string_view<char,_std::char_traits<char>_> *)__begin4);
        pvStack_1a0 = std::basic_string_view<char,_std::char_traits<char>_>::end
                                ((basic_string_view<char,_std::char_traits<char>_> *)__begin4);
        for (; f = str.
                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   .field_1.data_.loc.path, this = local_b0, __end4 != pvStack_1a0;
            __end4 = __end4 + 1) {
          local_1a1 = *__end4;
          bVar1 = absl::lts_20240722::ascii_isdigit(local_1a1);
          if (((bVar1) || (bVar1 = absl::lts_20240722::ascii_islower(local_1a1), bVar1)) ||
             (local_1a1 == '.')) {
            std::__cxx11::string::push_back((char)&__range4);
          }
          else {
            bVar1 = absl::lts_20240722::ascii_isupper(local_1a1);
            if (bVar1) {
              std::__cxx11::string::push_back((char)&__range4);
              absl::lts_20240722::ascii_tolower(local_1a1);
              std::__cxx11::string::push_back((char)&__range4);
            }
            else {
              pPVar4 = JsonLexer::options((JsonLexer *)desc);
              if ((pPVar4->allow_legacy_syntax & 1U) == 0) {
                pLVar2 = absl::lts_20240722::
                         StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                       *)local_80);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_1b8,"unexpected character in FieldMask");
                JsonLocation::SourceLocation::current();
                JsonLocation::Invalid
                          ((JsonLocation *)lex,&pLVar2->loc,local_1b8._M_len,local_1b8._M_str);
                paths._M_str._0_4_ = 1;
                goto LAB_004bdaac;
              }
              std::__cxx11::string::push_back((char)&__range4);
            }
          }
        }
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range4);
        x_00._M_str = in_R8;
        x_00._M_len = auVar6._8_8_;
        ParseProto3Type::SetString((ParseProto3Type *)this,(Field)f,auVar6._0_8_,x_00);
        paths._M_str._0_4_ = 0;
LAB_004bdaac:
        std::__cxx11::string::~string((string *)&__range4);
        if ((uint)paths._M_str != 0) goto LAB_004bdaf1;
        absl::lts_20240722::strings_internal::
        SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&__end3.delimiter_);
      }
      absl::lts_20240722::OkStatus();
      paths._M_str._0_4_ = 1;
    }
  }
LAB_004bdaf1:
  absl::lts_20240722::
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ::~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               *)local_80);
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseFieldMask(JsonLexer& lex, const Desc<Traits>& desc,
                            Msg<Traits>& msg) {
  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());
  auto paths = str->value.AsView();

  // The special case of the empty string is not handled correctly below,
  // because StrSplit("", ',') is [""], not [].
  if (paths.empty()) {
    return absl::OkStatus();
  }

  // google.protobuf.FieldMask has a single field with number 1.
  auto paths_field = Traits::MustHaveField(desc, 1);
  for (absl::string_view path : absl::StrSplit(paths, ',')) {
    std::string snake_path;
    // Assume approximately six-letter words, so add one extra space for an
    // underscore for every six bytes.
    snake_path.reserve(path.size() * 7 / 6);
    for (char c : path) {
      if (absl::ascii_isdigit(c) || absl::ascii_islower(c) || c == '.') {
        snake_path.push_back(c);
      } else if (absl::ascii_isupper(c)) {
        snake_path.push_back('_');
        snake_path.push_back(absl::ascii_tolower(c));
      } else if (lex.options().allow_legacy_syntax) {
        snake_path.push_back(c);
      } else {
        return str->loc.Invalid("unexpected character in FieldMask");
      }
    }
    Traits::SetString(paths_field, msg, snake_path);
  }

  return absl::OkStatus();
}